

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<std::complex<float>_*>::ReallocForNuma(TPZVec<std::complex<float>_*> *this)

{
  ulong uVar1;
  complex<float> **__src;
  complex<float> **__dest;
  
  uVar1 = this->fNElements;
  if ((uVar1 != 0) && (__src = this->fStore, __src != (complex<float> **)0x0)) {
    __dest = (complex<float> **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 << 3);
    memcpy(__dest,__src,uVar1 << 3);
    operator_delete__(__src);
    this->fStore = __dest;
  }
  return;
}

Assistant:

void ReallocForNuma() {
        if (fNElements == 0 || fStore == NULL)
            return;
        T* newStore = new T[fNElements];
        memcpy((void*)newStore,(void*)fStore,fNElements*sizeof(T));
        delete [] fStore;
        fStore = newStore;
	}